

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

sat_solver * IPdr_ManSetSolver(Pdr_Man_t *p,int k,int fSetPropOutput)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  sat_solver *psVar4;
  void **ppvVar5;
  Vec_Vec_t *pVVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  if (p->vSolvers->nSize != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                  ,0xdf,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
  }
  if (p->vActVars->nSize != k) {
    __assert_fail("Vec_IntSize(p->vActVars) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                  ,0xe0,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
  }
  psVar4 = zsat_solver_new_seed((double)p->pPars->nRandomSeed);
  psVar4 = Pdr_ManNewSolver(psVar4,p,k,(uint)(k == 0));
  pVVar2 = p->vSolvers;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar5;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_009043f9;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar5;
    }
    pVVar2->nCap = iVar9;
  }
LAB_009043f9:
  iVar9 = pVVar2->nSize;
  pVVar2->nSize = iVar9 + 1;
  pVVar2->pArray[iVar9] = psVar4;
  Vec_IntPush(p->vActVars,0);
  if (fSetPropOutput != 0) {
    Pdr_ManSetPropertyOutput(p,k);
  }
  if ((k != 0) && (pVVar6 = p->vClauses, k < pVVar6->nSize)) {
    uVar8 = (ulong)(uint)k;
    do {
      if (k < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar3 = pVVar6->pArray[uVar8];
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar7 = 0;
        do {
          Pdr_ManSolverAddClause(p,k,*(Pdr_Set_t **)(*(long *)((long)pvVar3 + 8) + lVar7 * 8));
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)pvVar3 + 4));
      }
      uVar8 = uVar8 + 1;
      pVVar6 = p->vClauses;
    } while ((int)uVar8 < pVVar6->nSize);
  }
  return psVar4;
}

Assistant:

sat_solver * IPdr_ManSetSolver( Pdr_Man_t * p, int k, int fSetPropOutput )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;

    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_IntSize(p->vActVars) == k );

    pSat = zsat_solver_new_seed(p->pPars->nRandomSeed);
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_IntPush( p->vActVars, 0 );

    // set the property output
    if ( fSetPropOutput )
        Pdr_ManSetPropertyOutput( p, k );

    if (k == 0)
        return pSat;

    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}